

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-defs.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::addElem
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Name param_1,Name *table,
          optional<wasm::Expression_*> offset,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *elems,Index pos)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  Module *pMVar4;
  pointer puVar5;
  pointer puVar6;
  Table *pTVar7;
  __uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> _Var8;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  string local_70;
  Err local_50;
  
  pMVar4 = this->wasm;
  uVar3 = this->index;
  puVar5 = (pMVar4->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Expression_*>._M_engaged == true) {
    *(_Storage<wasm::Expression_*,_true> *)
     ((long)puVar5[uVar3]._M_t.
            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
            _M_t + 0x28) =
         offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Expression_*>._M_payload;
    if (table == (Name *)0x0) {
      puVar6 = (pMVar4->tables).
               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pMVar4->tables).
          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == puVar6) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"active element segment with no table","");
        Lexer::err(&local_50,&this->in,(ulong)pos,&local_70);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        paVar2 = &local_50.msg.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50.msg._M_dataplus._M_p == paVar2) {
          *puVar1 = CONCAT71(local_50.msg.field_2._M_allocated_capacity._1_7_,
                             local_50.msg.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
               local_50.msg.field_2._8_8_;
        }
        else {
          *(pointer *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_50.msg._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(local_50.msg.field_2._M_allocated_capacity._1_7_,
                        local_50.msg.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
             local_50.msg._M_string_length;
        local_50.msg._M_string_length = 0;
        local_50.msg.field_2._M_local_buf[0] = '\0';
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return __return_storage_ptr__;
        }
        local_50.msg._M_dataplus._M_p = (pointer)paVar2;
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      pTVar7 = (puVar6->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
               super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      _Var8._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
           puVar5[uVar3]._M_t.
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t;
      uVar10 = *(undefined4 *)((long)&(pTVar7->super_Importable).super_Named + 4);
      uVar11 = *(undefined4 *)((long)&(pTVar7->super_Importable).super_Named + 8);
      uVar12 = *(undefined4 *)((long)&(pTVar7->super_Importable).super_Named + 0xc);
      *(undefined4 *)
       ((long)_Var8._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x18) =
           *(undefined4 *)&(pTVar7->super_Importable).super_Named;
      *(undefined4 *)
       ((long)_Var8._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x1c) = uVar10;
      *(undefined4 *)
       ((long)_Var8._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x20) = uVar11;
      *(undefined4 *)
       ((long)_Var8._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x24) = uVar12;
      goto code_r0x00b8ef92;
    }
    _Var9._M_head_impl =
         *(ElementSegment **)
          &puVar5[uVar3]._M_t.
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t;
    uVar10 = (undefined4)(table->super_IString).str._M_len;
    uVar11 = *(undefined4 *)((long)&(table->super_IString).str._M_len + 4);
    uVar12 = *(undefined4 *)&(table->super_IString).str._M_str;
    uVar13 = *(undefined4 *)((long)&(table->super_IString).str._M_str + 4);
  }
  else {
    *(undefined8 *)
     ((long)puVar5[uVar3]._M_t.
            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
            _M_t + 0x28) = 0;
    _Var9._M_head_impl =
         *(ElementSegment **)
          &puVar5[uVar3]._M_t.
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t;
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
  }
  *(undefined4 *)&(_Var9._M_head_impl)->table = uVar10;
  *(undefined4 *)((long)&(_Var9._M_head_impl)->table + 4) = uVar11;
  *(undefined4 *)((long)&(_Var9._M_head_impl)->table + 8) = uVar12;
  *(undefined4 *)((long)&(_Var9._M_head_impl)->table + 0xc) = uVar13;
code_r0x00b8ef92:
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::_M_move_assign
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             ((long)puVar5[uVar3]._M_t.
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t + 0x38),elems);
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDefsCtx::addElem(Name,
                               Name* table,
                               std::optional<Expression*> offset,
                               std::vector<Expression*>&& elems,
                               Index pos) {
  auto& e = wasm.elementSegments[index];
  if (offset) {
    e->offset = *offset;
    if (table) {
      e->table = *table;
    } else if (wasm.tables.size() > 0) {
      e->table = wasm.tables[0]->name;
    } else {
      return in.err(pos, "active element segment with no table");
    }
  } else {
    e->offset = nullptr;
    e->table = Name();
  }
  e->data = std::move(elems);
  return Ok{};
}